

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int flatcc_verify_struct_as_nested_root
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              char *fid,size_t size,uint16_t align)

{
  ushort uVar1;
  int iVar2;
  uint *puVar3;
  undefined6 in_register_0000008a;
  ulong elem_size;
  
  elem_size = CONCAT62(in_register_0000008a,align) & 0xffffffff;
  iVar2 = flatcc_verify_vector_field(td,id,required,elem_size,1,0xffffffff);
  if (iVar2 != 0) {
    iVar2 = flatcc_verify_vector_field(td,id,required,elem_size,1,0xffffffff);
    return iVar2;
  }
  uVar1 = id * 2 + 4;
  if (uVar1 < td->vsize) {
    uVar1 = *(ushort *)((long)td->vtable + (ulong)uVar1);
  }
  else {
    uVar1 = 0;
  }
  if (uVar1 == 0) {
    puVar3 = (uint *)0x0;
  }
  else {
    puVar3 = (uint *)((long)td->buf + (ulong)uVar1 + (ulong)td->table);
  }
  if (puVar3 != (uint *)0x0) {
    iVar2 = flatcc_verify_struct_as_root
                      ((uint *)((ulong)*puVar3 + (long)puVar3) + 1,
                       (ulong)*(uint *)((ulong)*puVar3 + (long)puVar3),fid,size,align);
    return iVar2;
  }
  return 0;
}

Assistant:

int flatcc_verify_struct_as_nested_root(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, const char *fid, size_t size, uint16_t align)
{
    const uoffset_t *buf;
    uoffset_t bufsiz;

    check_result(flatcc_verify_vector_field(td, id, required, align, 1, FLATBUFFERS_COUNT_MAX(1)));
    if (0 == (buf = get_field_ptr(td, id))) {
        return flatcc_verify_ok;
    }
    buf = (const uoffset_t *)((size_t)buf + read_uoffset(buf, 0));
    bufsiz = read_uoffset(buf, 0);
    ++buf;
    return flatcc_verify_struct_as_root(buf, bufsiz, fid, size, align);
}